

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int biseqcaseless(bstring b0,bstring b1)

{
  int iVar1;
  uint local_4c;
  uint local_44;
  uchar *local_40;
  uchar *local_38;
  int iStack_24;
  uchar c;
  int n;
  int i;
  bstring b1_local;
  bstring b0_local;
  
  if ((b0 == (bstring)0x0) || (b0->data == (uchar *)0x0)) {
    local_38 = (uchar *)0x0;
  }
  else {
    local_38 = b0->data;
  }
  if ((local_38 != (uchar *)0x0) && (-1 < b0->slen)) {
    if ((b1 == (bstring)0x0) || (b1->data == (uchar *)0x0)) {
      local_40 = (uchar *)0x0;
    }
    else {
      local_40 = b1->data;
    }
    if ((local_40 != (uchar *)0x0) && (-1 < b1->slen)) {
      if (b0->slen != b1->slen) {
        return 0;
      }
      if ((b0->data != b1->data) && (b0->slen != 0)) {
        iStack_24 = 0;
        iVar1 = b0->slen;
        do {
          if (iVar1 <= iStack_24) {
            return 1;
          }
          if (b0->data[iStack_24] != b1->data[iStack_24]) {
            if (b0->data[iStack_24] < 0x80) {
              local_44 = tolower((uint)b0->data[iStack_24]);
            }
            else {
              local_44 = (uint)b0->data[iStack_24];
            }
            if (b1->data[iStack_24] < 0x80) {
              local_4c = tolower((uint)b1->data[iStack_24]);
            }
            else {
              local_4c = (uint)b1->data[iStack_24];
            }
            if ((local_44 & 0xff) != (local_4c & 0xff)) {
              return 0;
            }
          }
          iStack_24 = iStack_24 + 1;
        } while( true );
      }
      return 1;
    }
  }
  return -1;
}

Assistant:

int biseqcaseless (const bstring b0, const bstring b1) {
int i, n;

	if (bdata (b0) == NULL || b0->slen < 0 || 
	    bdata (b1) == NULL || b1->slen < 0) return BSTR_ERR;
	if (b0->slen != b1->slen) return 0;
	if (b0->data == b1->data || b0->slen == 0) return 1;
	for (i=0, n=b0->slen; i < n; i++) {
		if (b0->data[i] != b1->data[i]) {
			unsigned char c = (unsigned char) downcase (b0->data[i]);
			if (c != (unsigned char) downcase (b1->data[i])) return 0;
		}
	}
	return 1;
}